

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int FindLatestMTMessage(uchar *buf,int buflen,int addr,int mid,uchar **pFoundMsg,
                       int *pFoundMsgTmpLen)

{
  int iVar1;
  int len;
  uchar *ptr;
  
  ptr = (uchar *)0x0;
  len = 0;
  iVar1 = FindMTMessage(buf,buflen,addr,mid,&ptr,&len);
  if (iVar1 == 0) {
    do {
      *pFoundMsg = ptr;
      *pFoundMsgTmpLen = len;
      iVar1 = GetLengthMTMessage(ptr);
      iVar1 = FindMTMessage(*pFoundMsg + iVar1,*pFoundMsgTmpLen - iVar1,addr,mid,&ptr,&len);
    } while (iVar1 == 0);
    iVar1 = 0;
  }
  else {
    *pFoundMsg = (uchar *)0x0;
    *pFoundMsgTmpLen = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int FindLatestMTMessage(unsigned char* buf, int buflen, int addr, int mid, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	unsigned char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindMTMessage(buf, buflen, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected total message length.
		msglen = GetLengthMTMessage(*pFoundMsg);

		// Search just after the message.
		if (FindMTMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, 
			addr, mid, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}